

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple16.h
# Opt level: O1

bool FastPForLib::Simple16<true>::tryme<1u,10u,2u,9u>(uint32_t *n,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  
  if ((len != 0) && (0x3ff < *n)) {
    return false;
  }
  uVar1 = (len - 1) + (ulong)(len == 0);
  uVar2 = 2;
  if (uVar1 < 2) {
    uVar2 = uVar1;
  }
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    uVar1 = (ulong)(len != 0);
    do {
      if (0x1ff < n[uVar1]) {
        return false;
      }
      uVar1 = uVar1 + 1;
      bVar3 = (uint)uVar1 < (int)uVar2 + (uint)(len != 0);
      bVar4 = !bVar3;
    } while (bVar3);
  }
  return bVar4;
}

Assistant:

static bool tryme(const uint32_t *n, size_t len) {
    const uint32_t min1 = (len < num1) ? static_cast<uint32_t>(len) : num1;
    for (uint32_t i = 0; i < min1; i++) {
      if ((n[i]) >= (1U << log1))
        return false;
    }
    const uint32_t min2 =
        (len - min1 < num2) ? static_cast<uint32_t>(len - min1) : num2;
    for (uint32_t i = min1; i < min1 + min2; i++) {
      if ((n[i]) >= (1U << log2))
        return false;
    }
    return true;
  }